

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_namedict.c
# Opt level: O0

HPDF_Dict HPDF_EmbeddedFile_GetParams(HPDF_EmbeddedFile emfile)

{
  HPDF_Dict dict;
  HPDF_STATUS HVar1;
  HPDF_Dict local_28;
  HPDF_Dict params;
  HPDF_Dict filestream;
  HPDF_EmbeddedFile emfile_local;
  
  dict = HPDF_EmbeddedFile_GetFileStream(emfile);
  if (dict == (HPDF_Dict)0x0) {
    emfile_local = (HPDF_EmbeddedFile)0x0;
  }
  else {
    local_28 = (HPDF_Dict)HPDF_Dict_GetItem(dict,"Params",0x11);
    if ((local_28 == (HPDF_Dict)0x0) &&
       ((local_28 = HPDF_Dict_New(emfile->mmgr), local_28 == (HPDF_Dict)0x0 ||
        (HVar1 = HPDF_Dict_Add(dict,"Params",local_28), HVar1 != 0)))) {
      emfile_local = (HPDF_EmbeddedFile)0x0;
    }
    else {
      emfile_local = local_28;
    }
  }
  return emfile_local;
}

Assistant:

static HPDF_Dict
HPDF_EmbeddedFile_GetParams  (HPDF_EmbeddedFile  emfile)
{
    HPDF_Dict filestream;
    HPDF_Dict params;

    filestream = HPDF_EmbeddedFile_GetFileStream(emfile);
    if (!filestream)
        return NULL;

    params = HPDF_Dict_GetItem(filestream, "Params", HPDF_OCLASS_DICT);
    if (!params) {
        params = HPDF_Dict_New (emfile->mmgr);
        if (!params || HPDF_Dict_Add (filestream, "Params", params) != HPDF_OK)
            return NULL;
    }
    return params;
}